

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_std::tuple<pstore::gsl::span<int,_-1L>_>_&>::~MatcherBase
          (MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&> *this)

{
  MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }